

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

__pid_t __thiscall kj::UnixEventPort::wait(UnixEventPort *this,void *__stat_loc)

{
  bool bVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  int local_50 [6];
  uint64_t local_38;
  Duration local_30;
  TimerImpl local_28;
  UnixEventPort *this_local;
  
  local_28.impl.ptr = (Impl *)this;
  local_30.value = (long)readClock(this);
  local_38 = 1000000;
  MaxValue_::operator_cast_to_int((MaxValue_ *)&maxValue);
  TimerImpl::timeoutToNextEvent(&local_28,(TimePoint)&this->timerImpl,local_30,local_38);
  Maybe<unsigned_long>::
  map<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_c__:417:16)>
            ((Maybe<unsigned_long> *)&local_28.impl,(anon_class_1_0_00000001 *)&local_28);
  local_50[0] = -1;
  piVar2 = Maybe<int>::orDefault((Maybe<int> *)&local_28.impl,local_50);
  bVar1 = doEpollWait(this,*piVar2);
  Maybe<int>::~Maybe((Maybe<int> *)&local_28.impl);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_28);
  return (__pid_t)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1);
}

Assistant:

bool UnixEventPort::wait() {
  return doEpollWait(
      timerImpl.timeoutToNextEvent(readClock(), MILLISECONDS, int(maxValue))
          .map([](uint64_t t) -> int { return t; })
          .orDefault(-1));
}